

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::Read
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,TPZStream *buf,void *context)

{
  long lVar1;
  
  TPZGeoCube::Read(&this->super_TPZGeoCube,buf,context);
  lVar1 = 0;
  do {
    (**(code **)(*(long *)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) +
                0x30))((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1,buf,
                       context);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1e0);
  lVar1 = 0x230;
  do {
    (**(code **)(*(long *)((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.
                                 fNodeIndexes + lVar1 + -8) + 0x30))
              ((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes
               + lVar1 + -8,buf,context);
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x22b0);
  return;
}

Assistant:

void Read(TPZStream &buf, void *context) override{
            TGeo::Read(buf, context);
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is].Read(buf, context);
            }
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fTrans[is].Read(buf, context);
            }
        }